

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2mat.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string *filename;
  undefined1 local_88 [8];
  MidiFile midifile;
  char **argv_local;
  int argc_local;
  
  midifile._104_8_ = argv;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::reserve(&matlabarray,100000);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&matlabarray);
  std::vector<int,_std::allocator<int>_>::resize(&legend_instr,0x80);
  std::vector<int,_std::allocator<int>_>::resize(&legend_opcode,0x80);
  std::vector<int,_std::allocator<int>_>::resize(&legend_controller,0x80);
  checkOptions(&options,argc,(char **)midifile._104_8_);
  filename = smf::Options::getArg_abi_cxx11_(&options,1);
  smf::MidiFile::MidiFile((MidiFile *)local_88,filename);
  convertMidiFile((MidiFile *)local_88,&matlabarray);
  if (verboseQ == 0) {
    printMatlabArray((MidiFile *)local_88,&matlabarray);
  }
  smf::MidiFile::~MidiFile((MidiFile *)local_88);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	matlabarray.reserve(100000);
	matlabarray.clear();

	legend_instr.resize(128);
	legend_opcode.resize(128);
	legend_controller.resize(128);

	checkOptions(options, argc, argv);
	MidiFile midifile(options.getArg(1));

	convertMidiFile(midifile, matlabarray);
	if (!verboseQ) {
		printMatlabArray(midifile, matlabarray);
	}
	return 0;
}